

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
FactoredDecPOMDPDiscrete::~FactoredDecPOMDPDiscrete(FactoredDecPOMDPDiscrete *this,void **vtt)

{
  vector<RewardModel_*,_std::allocator<RewardModel_*>_> *this_00;
  vector<RewardModel_*,_std::allocator<RewardModel_*>_> *pvVar1;
  reference ppRVar2;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_RSI;
  void **in_RDI;
  Index i;
  size_type in_stack_ffffffffffffffb8;
  FactoredQFunctionScopeForStage *in_stack_ffffffffffffffc0;
  uint local_14;
  
  *in_RDI = *(void **)&in_RSI->super_MultiAgentDecisionProcess;
  *(pointer *)((long)in_RDI + *(long *)((long)*in_RDI + -0x58)) =
       (in_RSI->super_MultiAgentDecisionProcess)._m_agents.
       super__Vector_base<Agent,_std::allocator<Agent>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)((long)in_RDI + *(long *)((long)*in_RDI + -0x60)) =
       (in_RSI->super_MultiAgentDecisionProcess)._m_agents.
       super__Vector_base<Agent,_std::allocator<Agent>_>._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)((long)in_RDI + *(long *)((long)*in_RDI + -0x68)) =
       (in_RSI->super_MultiAgentDecisionProcess)._m_agents.
       super__Vector_base<Agent,_std::allocator<Agent>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  *(pointer *)((long)in_RDI + *(long *)((long)*in_RDI + -0x70)) =
       (in_RSI->super_MultiAgentDecisionProcess)._m_allAgentsScope.super_SDT.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)((long)in_RDI + *(long *)((long)*in_RDI + -0x40)) =
       (in_RSI->super_MultiAgentDecisionProcess)._m_allAgentsScope.super_SDT.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)((long)in_RDI + *(long *)((long)*in_RDI + -0x50)) =
       (in_RSI->super_MultiAgentDecisionProcess)._m_allAgentsScope.super_SDT.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  *(undefined8 *)((long)in_RDI + *(long *)((long)*in_RDI + -0x48)) =
       *(undefined8 *)&(in_RSI->super_MultiAgentDecisionProcess)._m_problemFile;
  in_RDI[0xc0] = (void *)(in_RSI->super_MultiAgentDecisionProcess)._m_problemFile._M_string_length;
  local_14 = 0;
  while( true ) {
    this_00 = (vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)(ulong)local_14;
    pvVar1 = (vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)
             std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::size
                       ((vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)(in_RDI + 0xca));
    if (this_00 == pvVar1) break;
    ppRVar2 = std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::at
                        ((vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)
                         in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffc0 = (FactoredQFunctionScopeForStage *)*ppRVar2;
    if (in_stack_ffffffffffffffc0 != (FactoredQFunctionScopeForStage *)0x0) {
      (**(_func_int **)
         &(in_stack_ffffffffffffffc0->_m_agentScopes).
          super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data._M_start
          [1].super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)();
    }
    local_14 = local_14 + 1;
  }
  if ((long *)in_RDI[0xdf] != (long *)0x0) {
    (**(code **)(*in_RDI[0xdf] + 0x18))();
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_00);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  FactoredQFunctionScopeForStage::~FactoredQFunctionScopeForStage(in_stack_ffffffffffffffc0);
  std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::~vector(this_00);
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)this_00);
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)this_00);
  DecPOMDP::~DecPOMDP((DecPOMDP *)(in_RDI + 0xc0),
                      (void **)&(in_RSI->super_MultiAgentDecisionProcess)._m_name._m_description.
                                _M_string_length);
  MultiAgentDecisionProcessDiscreteFactoredStates::~MultiAgentDecisionProcessDiscreteFactoredStates
            (in_RSI,in_RDI);
  return;
}

Assistant:

FactoredDecPOMDPDiscrete::~FactoredDecPOMDPDiscrete()
{
    for(Index i=0;i!=_m_LRFs.size();++i)
        delete _m_LRFs.at(i);
    delete _m_p_rModel;
}